

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O3

void ipc_dialer_close(void *arg)

{
  nni_aio *aio;
  nng_stream *s;
  nni_list *list;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if (*(char *)((long)arg + 0x58) == '\0') {
    *(undefined1 *)((long)arg + 0x58) = 1;
    list = (nni_list *)((long)arg + 0x40);
    aio = (nni_aio *)nni_list_first(list);
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(list,aio);
      s = (nng_stream *)nni_aio_get_prov_data(aio);
      if (s != (nng_stream *)0x0) {
        s[3].s_get = (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0;
        nni_aio_set_prov_data(aio,(void *)0x0);
        nng_stream_close(s);
        nng_stream_stop(s);
        nng_stream_free(s);
      }
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(list);
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ipc_dialer_close(void *arg)
{
	ipc_dialer *d = arg;
	nni_mtx_lock(&d->mtx);
	if (!d->closed) {
		nni_aio *aio;
		d->closed = true;
		while ((aio = nni_list_first(&d->connq)) != NULL) {
			nni_ipc_conn *c;
			nni_list_remove(&d->connq, aio);
			if ((c = nni_aio_get_prov_data(aio)) != NULL) {
				c->dial_aio = NULL;
				nni_aio_set_prov_data(aio, NULL);
				nng_stream_close(&c->stream);
				nng_stream_stop(&c->stream);
				nng_stream_free(&c->stream);
			}
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
	}
	nni_mtx_unlock(&d->mtx);
}